

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_211787::AlsaCapture::stop(AlsaCapture *this)

{
  FILE *__stream;
  bool bVar1;
  ALCuint AVar2;
  int iVar3;
  undefined8 uVar4;
  vector<al::byte,_al::allocator<al::byte,_1UL>_> *in_RDI;
  int err;
  ALCuint in_stack_0000002c;
  vector<al::byte> temp;
  ALCuint avail;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  size_type in_stack_ffffffffffffffc8;
  vector<al::byte,_al::allocator<al::byte,_1UL>_> *in_stack_ffffffffffffffd0;
  
  AVar2 = availableSamples(_err);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x23416a);
  if ((!bVar1) && (AVar2 != 0)) {
    (*(anonymous_namespace)::psnd_pcm_frames_to_bytes)
              ((in_RDI->super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage,AVar2);
    std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::vector
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::data
              ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)0x2341b6);
    captureSamples((AlsaCapture *)
                   temp.super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   temp.super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                   super__Vector_impl_data._M_start,in_stack_0000002c);
    std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::operator=
              ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
    std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::~vector
              ((vector<al::byte,_al::allocator<al::byte,_1UL>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  iVar3 = (*(anonymous_namespace)::psnd_pcm_drop)
                    ((in_RDI->super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>)._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  __stream = gLogFile;
  if ((iVar3 < 0) && (0 < (int)gLogLevel)) {
    uVar4 = (*(anonymous_namespace)::psnd_strerror)(iVar3);
    fprintf((FILE *)__stream,"[ALSOFT] (EE) drop failed: %s\n",uVar4);
  }
  *(undefined1 *)
   &in_RDI[2].super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  return;
}

Assistant:

void AlsaCapture::stop()
{
    /* OpenAL requires access to unread audio after stopping, but ALSA's
     * snd_pcm_drain is unreliable and snd_pcm_drop drops it. Capture what's
     * available now so it'll be available later after the drop.
     */
    ALCuint avail{availableSamples()};
    if(!mRing && avail > 0)
    {
        /* The ring buffer implicitly captures when checking availability.
         * Direct access needs to explicitly capture it into temp storage. */
        auto temp = al::vector<al::byte>(
            static_cast<size_t>(snd_pcm_frames_to_bytes(mPcmHandle, avail)));
        captureSamples(temp.data(), avail);
        mBuffer = std::move(temp);
    }
    int err{snd_pcm_drop(mPcmHandle)};
    if(err < 0)
        ERR("drop failed: %s\n", snd_strerror(err));
    mDoCapture = false;
}